

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeval.c
# Opt level: O0

timeval curlx_tvnow(void)

{
  undefined1 local_18 [8];
  timeval now;
  
  gettimeofday((timeval *)local_18,(__timezone_ptr_t)0x0);
  return _local_18;
}

Assistant:

struct timeval curlx_tvnow(void)
{
  /*
  ** gettimeofday() is not granted to be increased monotonically, due to
  ** clock drifting and external source time synchronization it can jump
  ** forward or backward in time.
  */
  struct timeval now;
  (void)gettimeofday(&now, NULL);
  return now;
}